

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMNode.h
# Opt level: O0

void __thiscall dg::LLVMNode::LLVMNode(LLVMNode *this,Value *val,bool owns_value)

{
  byte in_DL;
  pointer in_RDI;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *in_stack_ffffffffffffffe0;
  
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::Node
            (in_stack_ffffffffffffffe0,(Value **)in_RDI);
  std::unique_ptr<llvm::Value,dg::LLVMNode::LLVMValueDeleter>::
  unique_ptr<dg::LLVMNode::LLVMValueDeleter,void>
            ((unique_ptr<llvm::Value,_dg::LLVMNode::LLVMValueDeleter> *)in_stack_ffffffffffffffe0);
  if ((in_DL & 1) != 0) {
    std::unique_ptr<llvm::Value,dg::LLVMNode::LLVMValueDeleter>::
    unique_ptr<dg::LLVMNode::LLVMValueDeleter,void>
              ((unique_ptr<llvm::Value,_dg::LLVMNode::LLVMValueDeleter> *)in_stack_ffffffffffffffe0,
               in_RDI);
    std::unique_ptr<llvm::Value,_dg::LLVMNode::LLVMValueDeleter>::operator=
              ((unique_ptr<llvm::Value,_dg::LLVMNode::LLVMValueDeleter> *)in_stack_ffffffffffffffe0,
               (unique_ptr<llvm::Value,_dg::LLVMNode::LLVMValueDeleter> *)in_RDI);
    std::unique_ptr<llvm::Value,_dg::LLVMNode::LLVMValueDeleter>::~unique_ptr
              ((unique_ptr<llvm::Value,_dg::LLVMNode::LLVMValueDeleter> *)in_stack_ffffffffffffffe0)
    ;
  }
  return;
}

Assistant:

LLVMNode(llvm::Value *val, bool owns_value = false)
            : dg::Node<LLVMDependenceGraph, llvm::Value *, LLVMNode>(val) {
        if (owns_value)
#if LLVM_VERSION_MAJOR >= 5
            owned_key = std::unique_ptr<llvm::Value, LLVMValueDeleter>(val);
#else
            owned_key = std::unique_ptr<llvm::Value>(val);
#endif
    }